

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

void expandSeeds(tree_t *tree,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  byte bVar1;
  uint8_t *puVar2;
  picnic_instance_t *ppVar3;
  _Bool _Var4;
  uint j;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  BitSequence **data;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  picnic_instance_t *in_stack_fffffffffffffb08;
  uint16_t data0_le;
  ulong local_4e8;
  ulong local_4e0;
  uint local_4d4;
  undefined2 local_4ce;
  uint16_t data2_le;
  uint16_t data1_le;
  ulong local_4c8;
  uint local_4bc;
  ulong local_4b8;
  ulong local_4b0;
  uint8_t *local_4a8;
  uint local_49c;
  uint8_t *local_498;
  picnic_instance_t *local_490;
  uint8_t *tmp_ptr [4];
  uint8_t tmp [256];
  Keccak_HashInstancetimes4 local_368;
  
  tmp_ptr[0] = tmp;
  local_4e8 = (ulong)params->seed_size;
  tmp_ptr[1] = tmp + 0x40;
  tmp_ptr[2] = tmp + 0x80;
  tmp_ptr[3] = tmp + 0xc0;
  local_4bc = (tree->numNodes >> 1) - 1;
  local_4b0 = 2;
  if (local_4bc < 2) {
    local_4b0 = (ulong)local_4bc;
  }
  local_498 = tmp + local_4e8;
  local_4b8 = (ulong)((uint)params->seed_size * 2);
  uVar8 = (ulong)((int)local_4b0 + 1);
  local_4e0 = CONCAT44(local_4e0._4_4_,1);
  uVar12 = 2;
  local_4c8 = 4;
  lVar7 = 0;
  local_4d4 = repIndex;
  local_4a8 = salt;
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    _Var4 = haveNode(tree,(uint)uVar5);
    if (_Var4) {
      hashSeed(tmp,tree->nodes + lVar7,local_4a8,(uint8_t)local_4d4,(uint)uVar5,(uint)params,
               in_stack_fffffffffffffb08);
      _Var4 = haveNode(tree,(uint)local_4e0);
      if (!_Var4) {
        memcpy(tree->nodes + lVar7 * 2 + local_4e8,tmp,local_4e8);
        markNode(tree,(uint)local_4e0);
      }
      if (((uint)(tree->haveNodeExists[uVar12 >> 5] >> (local_4c8 & 0x3f)) & 3) == 1) {
        memcpy(tree->nodes + lVar7 * 2 + local_4b8,local_498,local_4e8);
        markNode(tree,(uint)uVar12);
      }
    }
    local_4e0 = CONCAT44(local_4e0._4_4_,(uint)local_4e0 + 2);
    local_4c8 = local_4c8 + 4;
    lVar7 = lVar7 + local_4e8;
    uVar12 = uVar12 + 2;
  }
  local_49c = local_4bc & 0xfffffffc;
  uVar11 = (int)local_4b0 * 4 + 8;
  uVar10 = (int)local_4b0 * 2 + 3;
  local_490 = params;
  while( true ) {
    ppVar3 = local_490;
    uVar12 = (ulong)uVar10;
    uVar10 = (uint)uVar8;
    if (local_49c < uVar10) break;
    local_4b8 = CONCAT44(local_4b8._4_4_,uVar11);
    bVar1 = local_490->seed_size;
    uVar5 = (ulong)bVar1;
    data0_le = CONCAT11(data0_le._1_1_,1);
    if (local_490->digest_size == ' ') {
      uVar9 = 0x540;
      uVar11 = 0x100;
    }
    else {
      uVar9 = 0x440;
      uVar11 = 0x200;
    }
    local_4c8 = uVar12;
    Keccak_HashInitializetimes4(&local_368,uVar9,uVar11,0,'\x1f');
    uVar6 = uVar8 & 0xffffffff;
    hash_update_x4_1(&local_368,(uint8_t *)&data0_le,1);
    puVar2 = tree->nodes;
    local_4e0 = (ulong)(uVar10 + 1);
    local_4b0 = (ulong)(uVar10 + 2);
    hash_update_x4_4(&local_368,puVar2 + uVar5 * uVar6,puVar2 + local_4e0 * uVar5,
                     puVar2 + local_4b0 * uVar5,puVar2 + (uVar10 + 3) * uVar5,uVar5);
    hash_update_x4_1(&local_368,local_4a8,0x20);
    data0_le = (uint16_t)local_4d4;
    hash_update_x4_1(&local_368,(uint8_t *)&data0_le,2);
    data0_le = (uint16_t)uVar8;
    local_4ce = (undefined2)(uVar10 + 3);
    data1_le = (uint16_t)local_4e0;
    data2_le = (uint16_t)local_4b0;
    hash_update_x4_4(&local_368,(uint8_t *)&data0_le,(uint8_t *)&data1_le,(uint8_t *)&data2_le,
                     (uint8_t *)&local_4ce,2);
    Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
    data = tmp_ptr;
    Keccak_HashSqueezetimes4(&local_368,data,(ulong)bVar1 << 4);
    uVar8 = (ulong)(uVar10 + 4);
    uVar12 = local_4c8;
    uVar10 = (uint)local_4b8;
    local_4e0 = uVar8;
    for (; uVar6 < uVar8; uVar6 = uVar6 + 1) {
      _Var4 = haveNode(tree,(uint)uVar6);
      uVar11 = (uint)uVar12;
      if (_Var4) {
        _Var4 = haveNode(tree,uVar11);
        if (!_Var4) {
          memcpy(tree->nodes + (uVar12 & 0xffffffff) * local_4e8,*data,local_4e8);
          markNode(tree,uVar11);
        }
        if (((uint)(tree->haveNodeExists[uVar10 >> 6] >> ((byte)uVar10 & 0x3c)) & 3) == 1) {
          memcpy(tree->nodes + (uVar11 + 1) * local_4e8,*data + local_4e8,local_4e8);
          uVar8 = local_4e0;
          markNode(tree,uVar11 + 1);
        }
      }
      uVar12 = (ulong)(uVar11 + 2);
      uVar10 = uVar10 + 4;
      data = data + 1;
    }
    uVar10 = (int)local_4c8 + 8;
    uVar11 = (uint)local_4b8 + 0x10;
  }
  while( true ) {
    uVar10 = (uint)uVar8;
    if (local_4bc < uVar10) break;
    _Var4 = haveNode(tree,uVar10);
    uVar9 = (uint)uVar12;
    if (_Var4) {
      hashSeed(tmp,tree->nodes + (uVar8 & 0xffffffff) * local_4e8,local_4a8,(uint8_t)local_4d4,
               uVar10,(uint)ppVar3,in_stack_fffffffffffffb08);
      _Var4 = haveNode(tree,uVar9);
      if (!_Var4) {
        memcpy(tree->nodes + uVar12 * local_4e8,tmp,local_4e8);
        markNode(tree,uVar9);
      }
      if (((uint)(tree->haveNodeExists[uVar11 >> 6] >> ((byte)uVar11 & 0x3c)) & 3) == 1) {
        memcpy(tree->nodes + (uVar9 + 1) * local_4e8,local_498,local_4e8);
        markNode(tree,uVar9 + 1);
      }
    }
    uVar8 = (ulong)(uVar10 + 1);
    uVar12 = (ulong)(uVar9 + 2);
    uVar11 = uVar11 + 4;
  }
  return;
}

Assistant:

static void expandSeeds(tree_t* tree, uint8_t* salt, unsigned int repIndex,
                        const picnic_instance_t* params) {
  const size_t seed_size = params->seed_size;

  uint8_t tmp[4 * 2 * MAX_SEED_SIZE_BYTES];
  uint8_t* tmp_ptr[4] = {&tmp[0], &tmp[2 * MAX_SEED_SIZE_BYTES], &tmp[2 * 2 * MAX_SEED_SIZE_BYTES],
                         &tmp[3 * 2 * MAX_SEED_SIZE_BYTES]};

  /* Walk the tree, expanding seeds where possible. Compute children of
   * non-leaf nodes. */
  const unsigned int lastNonLeaf = getParent(tree->numNodes - 1);
  unsigned int i                 = 0;
  /* expand the first 4 seeds*/
  for (; i <= MIN(2, lastNonLeaf); i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
  /* now hash in groups of 4 for faster hashing */
  for (; i <= lastNonLeaf / 4 * 4; i += 4) {
    hashSeed_x4(tmp_ptr, tree, salt, HASH_PREFIX_1, repIndex, i, params);

    for (unsigned int j = i; j < i + 4; j++) {
      if (!haveNode(tree, j)) {
        continue;
      }
      if (!haveNode(tree, 2 * j + 1)) {
        /* left child = H_left(seed_i || salt || t || j) */
        memcpy(&tree->nodes[(2 * j + 1) * seed_size], tmp_ptr[j - i], seed_size);
        markNode(tree, 2 * j + 1);
      }

      /* The last non-leaf node will only have a left child when there are an odd number of leaves
       */
      if (existsNotHaveNode(tree, 2 * j + 2)) {
        /* right child = H_right(seed_i || salt || t || j)  */
        memcpy(&tree->nodes[(2 * j + 2) * seed_size], tmp_ptr[j - i] + seed_size, seed_size);
        markNode(tree, 2 * j + 2);
      }
    }
  }
  /* handle last few, which are not a multiple of 4 */
  for (; i <= lastNonLeaf; i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
}